

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O0

void demmt_nouveau_decode_gem_pushbuf_data
               (int nr_buffers,drm_nouveau_gem_pushbuf_bo *buffers,int nr_push,
               drm_nouveau_gem_pushbuf_push *push,int nr_relocs,
               drm_nouveau_gem_pushbuf_reloc *relocs)

{
  uint64_t address;
  gpu_object *dev_00;
  gpu_mapping *gpu_mapping;
  char *in_stack_ffffffffffffff38;
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffff58;
  gpu_mapping *gmapping;
  uint64_t gpu_start;
  gpu_object *dev;
  pushbuf_decode_state pstate;
  int i;
  drm_nouveau_gem_pushbuf_reloc *relocs_local;
  int nr_relocs_local;
  drm_nouveau_gem_pushbuf_push *push_local;
  int nr_push_local;
  drm_nouveau_gem_pushbuf_bo *buffers_local;
  int nr_buffers_local;
  
  if (dump_decoded_ioctl_data != 0) {
    for (pstate.fifo._4_4_ = 0; (int)pstate.fifo._4_4_ < nr_buffers;
        pstate.fifo._4_4_ = pstate.fifo._4_4_ + 1) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: buffer[%d]: handle: %s%2d%s",(ulong)pstate.fifo._4_4_,colors->num,
                (ulong)buffers[(int)pstate.fifo._4_4_].handle,colors->reset);
      }
      else {
        in_stack_ffffffffffffff38 = colors->reset;
        fprintf(_stdout,"%64sbuffer[%d]: handle: %s%2d%s"," ",(ulong)pstate.fifo._4_4_,colors->num,
                (ulong)buffers[(int)pstate.fifo._4_4_].handle,in_stack_ffffffffffffff38);
      }
      fprintf(_stdout,", read_domains: %s","");
      decode_domain(buffers[(int)pstate.fifo._4_4_].read_domains,4);
      fprintf(_stdout,", write_domains: %s","");
      decode_domain(buffers[(int)pstate.fifo._4_4_].write_domains,4);
      fprintf(_stdout,", valid_domains: %s","");
      decode_domain(buffers[(int)pstate.fifo._4_4_].valid_domains,4);
      fprintf(_stdout,", presumed.valid: %d",(ulong)buffers[(int)pstate.fifo._4_4_].presumed.valid);
      fprintf(_stdout,", presumed.domain: %s","");
      decode_domain(buffers[(int)pstate.fifo._4_4_].presumed.domain,4);
      fprintf(_stdout,", presumed.gpu_start: %s0x%lx%s",colors->eval,
              buffers[(int)pstate.fifo._4_4_].presumed.offset,colors->reset);
      fprintf(_stdout,"\n");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    for (pstate.fifo._4_4_ = 0; (int)pstate.fifo._4_4_ < nr_relocs;
        pstate.fifo._4_4_ = pstate.fifo._4_4_ + 1) {
      uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      if (indent_logs == 0) {
        in_stack_ffffffffffffff38 = (char *)CONCAT44(uVar1,relocs[(int)pstate.fifo._4_4_].flags);
        in_stack_ffffffffffffff40 = CONCAT44(uVar2,relocs[(int)pstate.fifo._4_4_].data);
        in_stack_ffffffffffffff48 = CONCAT44(uVar3,relocs[(int)pstate.fifo._4_4_].vor);
        in_stack_ffffffffffffff50 = CONCAT44(uVar4,relocs[(int)pstate.fifo._4_4_].tor);
        fprintf(_stdout,
                "LOG: relocs[%d]: reloc_bo_index: %d, reloc_bo_offset: %d, bo_index: %d, flags: 0x%x, data: 0x%x, vor: 0x%x, tor: 0x%x\n"
                ,(ulong)pstate.fifo._4_4_,(ulong)relocs[(int)pstate.fifo._4_4_].reloc_bo_index,
                (ulong)relocs[(int)pstate.fifo._4_4_].reloc_bo_offset,
                (ulong)relocs[(int)pstate.fifo._4_4_].bo_index,in_stack_ffffffffffffff38,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
      }
      else {
        in_stack_ffffffffffffff38 = (char *)CONCAT44(uVar1,relocs[(int)pstate.fifo._4_4_].bo_index);
        in_stack_ffffffffffffff40 = CONCAT44(uVar2,relocs[(int)pstate.fifo._4_4_].flags);
        in_stack_ffffffffffffff48 = CONCAT44(uVar3,relocs[(int)pstate.fifo._4_4_].data);
        in_stack_ffffffffffffff50 = CONCAT44(uVar4,relocs[(int)pstate.fifo._4_4_].vor);
        in_stack_ffffffffffffff58 =
             CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                      relocs[(int)pstate.fifo._4_4_].tor);
        fprintf(_stdout,
                "%64srelocs[%d]: reloc_bo_index: %d, reloc_bo_offset: %d, bo_index: %d, flags: 0x%x, data: 0x%x, vor: 0x%x, tor: 0x%x\n"
                ," ",(ulong)pstate.fifo._4_4_,(ulong)relocs[(int)pstate.fifo._4_4_].reloc_bo_index,
                (ulong)relocs[(int)pstate.fifo._4_4_].reloc_bo_offset,in_stack_ffffffffffffff38,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                in_stack_ffffffffffffff58);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    for (pstate.fifo._4_4_ = 0; (int)pstate.fifo._4_4_ < nr_push;
        pstate.fifo._4_4_ = pstate.fifo._4_4_ + 1) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: push[%d]: bo_index: %d, offset: %s0x%lx%s, length: %s0x%lx%s",
                (ulong)pstate.fifo._4_4_,(ulong)push[(int)pstate.fifo._4_4_].bo_index,colors->num,
                push[(int)pstate.fifo._4_4_].offset,colors->reset,colors->num,
                push[(int)pstate.fifo._4_4_].length & 0x7ffffc,colors->reset);
      }
      else {
        fprintf(_stdout,"%64spush[%d]: bo_index: %d, offset: %s0x%lx%s, length: %s0x%lx%s"," ",
                (ulong)pstate.fifo._4_4_,(ulong)push[(int)pstate.fifo._4_4_].bo_index,colors->num,
                push[(int)pstate.fifo._4_4_].offset,colors->reset,colors->num,
                push[(int)pstate.fifo._4_4_].length & 0x7ffffc,colors->reset);
      }
      if ((push[(int)pstate.fifo._4_4_].length & 1) != 0) {
        fprintf(_stdout,", unk8: 1%s","");
      }
      if ((push[(int)pstate.fifo._4_4_].length & 2) != 0) {
        fprintf(_stdout,", not_main: 1%s","");
      }
      if ((push[(int)pstate.fifo._4_4_].length & 0x800000) != 0) {
        fprintf(_stdout,", no_prefetch: 1%s","");
      }
      fprintf(_stdout,"\n");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  memset(&dev,0,0x30);
  pstate._32_8_ = gpu_object_find(0,0xf1f0eeee);
  dev_00 = nvrm_get_device((gpu_object *)pstate._32_8_);
  for (pstate.fifo._4_4_ = 0; (int)pstate.fifo._4_4_ < nr_push;
      pstate.fifo._4_4_ = pstate.fifo._4_4_ + 1) {
    address = buffers[push[(int)pstate.fifo._4_4_].bo_index].presumed.offset;
    gpu_mapping = gpu_mapping_find(address,dev_00);
    if (gpu_mapping == (gpu_mapping *)0x0) {
      fprintf(_stdout,"ERROR: couldn\'t find buffer 0x%lx\n",address);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    else {
      pushbuf_print((pushbuf_decode_state *)&dev,gpu_mapping,
                    address + push[(int)pstate.fifo._4_4_].offset,
                    (int)((push[(int)pstate.fifo._4_4_].length & 0x7ffffc) >> 2));
    }
  }
  return;
}

Assistant:

static void demmt_nouveau_decode_gem_pushbuf_data(
		int nr_buffers, struct drm_nouveau_gem_pushbuf_bo *buffers,
		int nr_push,    struct drm_nouveau_gem_pushbuf_push *push,
		int nr_relocs,  struct drm_nouveau_gem_pushbuf_reloc *relocs)
{
	int i;

	if (dump_decoded_ioctl_data)
	{
		for (i = 0; i < nr_buffers; ++i)
		{
			mmt_log("buffer[%d]: handle: %s%2d%s",
					i, colors->num, buffers[i].handle, colors->reset);
			mmt_log_cont(", read_domains: %s", "");
			decode_domain(buffers[i].read_domains, 4);
			mmt_log_cont(", write_domains: %s", "");
			decode_domain(buffers[i].write_domains, 4);
			mmt_log_cont(", valid_domains: %s", "");
			decode_domain(buffers[i].valid_domains, 4);
			mmt_log_cont(", presumed.valid: %d", buffers[i].presumed.valid);
			mmt_log_cont(", presumed.domain: %s", "");
			decode_domain(buffers[i].presumed.domain, 4);
			mmt_log_cont(", presumed.gpu_start: %s0x%" PRIx64 "%s",
					colors->eval, buffers[i].presumed.offset, colors->reset);
			mmt_log_cont_nl();
		}
		for (i = 0; i < nr_relocs; ++i)
			mmt_log("relocs[%d]: reloc_bo_index: %d, reloc_bo_offset: %d, bo_index: %d, flags: 0x%x, data: 0x%x, vor: 0x%x, tor: 0x%x\n",
					i, relocs[i].reloc_bo_index, relocs[i].reloc_bo_offset,
					relocs[i].bo_index, relocs[i].flags, relocs[i].data,
					relocs[i].vor, relocs[i].tor);
		for (i = 0; i < nr_push; ++i)
		{
			mmt_log("push[%d]: bo_index: %d, offset: %s0x%" PRIx64 "%s, length: %s0x%" PRIx64 "%s",
					i, push[i].bo_index, colors->num, push[i].offset, colors->reset,
					colors->num, push[i].length & 0x007ffffc, colors->reset);
			if (push[i].length & 1)
				mmt_log_cont(", unk8: 1%s", "");
			if (push[i].length & 2)
				mmt_log_cont(", not_main: 1%s", "");
			if (push[i].length & 0x00800000)
				mmt_log_cont(", no_prefetch: 1%s", "");
			mmt_log_cont_nl();
		}
	}

	struct pushbuf_decode_state pstate = { 0 };
	pstate.fifo = gpu_object_find(0, 0xf1f0eeee); // hack
	struct gpu_object *dev = nvrm_get_device(pstate.fifo);

	for (i = 0; i < nr_push; ++i)
	{
		uint64_t gpu_start = buffers[push[i].bo_index].presumed.offset;

		struct gpu_mapping *gmapping = gpu_mapping_find(gpu_start, dev);
		if (gmapping)
			pushbuf_print(&pstate, gmapping, gpu_start + push[i].offset, (push[i].length & 0x007ffffc) >> 2);
		else
			mmt_error("couldn't find buffer 0x%" PRIx64 "\n", gpu_start);
	}
}